

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void __thiscall Client::OnConnect(Client *this,Handle *handle,uint32_t error)

{
  ostream *poVar1;
  Session *this_00;
  element_type *peVar2;
  mapped_type *ppSVar3;
  void *this_01;
  lock_guard<std::mutex> local_68;
  lock_guard<std::mutex> lock;
  Session *session;
  uint32_t error_local;
  Handle *handle_local;
  Client *this_local;
  memory_order __b;
  
  if (error == 0) {
    std::__atomic_base<unsigned_int>::operator++
              (&(this->_num_connected).super___atomic_base<unsigned_int>,0);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    if ((this->_num_connected).super___atomic_base<unsigned_int>._M_i == this->_session_count) {
      poVar1 = (ostream *)std::ostream::operator<<(&std::cout,this->_session_count);
      poVar1 = std::operator<<(poVar1," sessions all connected");
      std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    }
    this_00 = (Session *)operator_new(0x18);
    Session::Session(this_00,this);
    peVar2 = std::__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)handle);
    (*peVar2->_vptr_CNSocket[9])(peVar2,this_00);
    std::shared_ptr<cppnet::CNSocket>::shared_ptr((shared_ptr<cppnet::CNSocket> *)&lock,handle);
    Session::OnConnection(this_00,(shared_ptr<cppnet::CNSocket> *)&lock);
    std::shared_ptr<cppnet::CNSocket>::~shared_ptr((shared_ptr<cppnet::CNSocket> *)&lock);
    std::lock_guard<std::mutex>::lock_guard(&local_68,&this->_mutex);
    ppSVar3 = std::
              unordered_map<std::shared_ptr<cppnet::CNSocket>,_Session_*,_std::hash<std::shared_ptr<cppnet::CNSocket>_>,_std::equal_to<std::shared_ptr<cppnet::CNSocket>_>,_std::allocator<std::pair<const_std::shared_ptr<cppnet::CNSocket>,_Session_*>_>_>
              ::operator[](&this->_sessions,handle);
    *ppSVar3 = this_00;
    std::lock_guard<std::mutex>::~lock_guard(&local_68);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cout," something error while connect. error :  ");
    this_01 = (void *)std::ostream::operator<<(poVar1,error);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

void OnConnect(cppnet::Handle handle, uint32_t error) {
        if (error == cppnet::CEC_SUCCESS) {
            _num_connected++;
            if (_num_connected.load() == _session_count) {
                std::cout << _session_count << " sessions all connected" << std::endl;
            }
            auto session = new Session(this);
            handle->SetContext(session);
            session->OnConnection(handle);

            std::lock_guard<std::mutex> lock(_mutex);
            _sessions[handle] = session;

        } else {
            std::cout << " something error while connect. error :  " << error << std::endl;
        }
    }